

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O2

char * lj_debug_uvnamev(cTValue *o,uint32_t idx,TValue **tvp,GCobj **op)

{
  TValue *pTVar1;
  GCobj *pGVar2;
  char *pcVar3;
  
  if ((o->field_4).it >> 0xf == 0x1fff7) {
    pGVar2 = (GCobj *)((ulong)o->field_4 & 0x7fffffffffff);
    if ((pGVar2->gch).unused1 == '\0') {
      pTVar1 = (pGVar2->th).base;
      if (idx < *(byte *)((long)pTVar1 + -0x2c)) {
        pGVar2 = *(GCobj **)((long)pGVar2 + (ulong)idx * 8 + 0x28);
        *tvp = (TValue *)(pGVar2->gch).metatable.gcptr64;
        *op = pGVar2;
        pcVar3 = lj_debug_uvname((GCproto *)&pTVar1[-0xd].gcr,idx);
        return pcVar3;
      }
    }
    else if (idx < (pGVar2->gch).unused2) {
      *tvp = (TValue *)((long)pGVar2 + (ulong)idx * 8 + 0x30);
      *op = pGVar2;
      return "";
    }
  }
  return (char *)0x0;
}

Assistant:

const char *lj_debug_uvnamev(cTValue *o, uint32_t idx, TValue **tvp, GCobj **op)
{
  if (tvisfunc(o)) {
    GCfunc *fn = funcV(o);
    if (isluafunc(fn)) {
      GCproto *pt = funcproto(fn);
      if (idx < pt->sizeuv) {
	GCobj *uvo = gcref(fn->l.uvptr[idx]);
	*tvp = uvval(&uvo->uv);
	*op = uvo;
	return lj_debug_uvname(pt, idx);
      }
    } else {
      if (idx < fn->c.nupvalues) {
	*tvp = &fn->c.upvalue[idx];
	*op = obj2gco(fn);
	return "";
      }
    }
  }
  return NULL;
}